

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# view.cpp
# Opt level: O3

Time __thiscall minibag::View::getBeginTime(View *this)

{
  pointer ppMVar1;
  MessageRange *pMVar2;
  _Base_ptr p_Var3;
  char cVar4;
  pointer ppMVar5;
  Time begin;
  TimeBase<miniros::Time,_miniros::Duration> local_28;
  
  update(this);
  ppMVar1 = (this->ranges_).
            super__Vector_base<minibag::MessageRange_*,_std::allocator<minibag::MessageRange_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  local_28 = miniros::TIME_MAX;
  for (ppMVar5 = (this->ranges_).
                 super__Vector_base<minibag::MessageRange_*,_std::allocator<minibag::MessageRange_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppMVar5 != ppMVar1;
      ppMVar5 = ppMVar5 + 1) {
    pMVar2 = *ppMVar5;
    cVar4 = miniros::TimeBase<miniros::Time,miniros::Duration>::operator<
                      ((TimeBase<miniros::Time,miniros::Duration> *)((pMVar2->begin)._M_node + 1),
                       (Time *)&local_28);
    if (cVar4 != '\0') {
      p_Var3 = (pMVar2->begin)._M_node;
      local_28.sec = p_Var3[1]._M_color;
      local_28.nsec = *(uint32_t *)&p_Var3[1].field_0x4;
    }
  }
  return (Time)local_28;
}

Assistant:

miniros::Time View::getBeginTime()
{
  update();

  miniros::Time begin = miniros::TIME_MAX;

  for (minibag::MessageRange* range : ranges_)
  {
    if (range->begin->time < begin)
      begin = range->begin->time;
  }

  return begin;
}